

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::AddNodePrefixesChecked
               (aiNode *node,char *prefix,uint len,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  iterator iVar1;
  pointer pSVar2;
  uint i;
  uint uVar3;
  ulong uVar4;
  uint hash;
  aiNode *local_38;
  
  uVar3 = 0;
  hash = SuperFastHash((node->mName).data,(node->mName).length,0);
  pSVar2 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = node;
  do {
    uVar4 = (ulong)uVar3;
    if ((ulong)(((long)(input->
                       super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x60) <= uVar4)
    {
LAB_0059d360:
      for (uVar4 = 0; uVar4 < node->mNumChildren; uVar4 = uVar4 + 1) {
        AddNodePrefixesChecked(node->mChildren[uVar4],prefix,len,input,cur);
      }
      return;
    }
    if (cur != uVar3) {
      iVar1 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find(&pSVar2[uVar4].hashes._M_t,&hash);
      node = local_38;
      pSVar2 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar1._M_node != (_Base_ptr)((long)&pSVar2[uVar4].hashes._M_t._M_impl + 8U)) {
        PrefixString(&local_38->mName,prefix,len);
        goto LAB_0059d360;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void SceneCombiner::AddNodePrefixesChecked(aiNode* node, const char* prefix, unsigned int len,
        std::vector<SceneHelper>& input, unsigned int cur) {
    ai_assert(NULL != prefix);
    const unsigned int hash = SuperFastHash(node->mName.data, static_cast<uint32_t>(node->mName.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            PrefixString(node->mName,prefix,len);
            break;
        }
    }

    // Process all children recursively
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        AddNodePrefixesChecked(node->mChildren[i],prefix,len,input,cur);
}